

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O0

bool duckdb::TypeVisitor::
     Contains<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_vector_cpp:423:37)>
               (LogicalType *type,anon_class_1_0_00000001 *predicate)

{
  bool bVar1;
  LogicalTypeId LVar2;
  anon_class_1_0_00000001 *predicate_00;
  LogicalType *type_00;
  LogicalType *in_RSI;
  LogicalType *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  child_list_t<LogicalType> *__range3_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child;
  const_iterator __end3;
  const_iterator __begin3;
  child_list_t<LogicalType> *__range3;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff70;
  int local_6c;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_60;
  LogicalType *in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_28;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffe0;
  byte local_1;
  
  bVar1 = IsStructOrArrayRecursive::anon_class_1_0_00000001::operator()
                    (in_stack_ffffffffffffff70,
                     (LogicalType *)
                     CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  if (bVar1) {
    local_1 = 1;
  }
  else {
    LVar2 = LogicalType::id(in_RDI);
    type_00 = (LogicalType *)(ulong)(byte)(LVar2 + 0x9c);
    switch(type_00) {
    case (LogicalType *)0x0:
      predicate_00 = (anon_class_1_0_00000001 *)StructType::GetChildTypes(type_00);
      local_28._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
            *)::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
      while (bVar1 = __gnu_cxx::
                     operator!=<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                 *)type_00,
                                (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff6f,
                                            CONCAT16(in_stack_ffffffffffffff6e,
                                                     in_stack_ffffffffffffff68))), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
        ::operator*(&local_28);
        bVar1 = Contains<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_vector_cpp:423:37)_&>
                          (in_RSI,predicate_00);
        if (bVar1) {
          local_1 = 1;
          goto LAB_02bd5da2;
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
        ::operator++(&local_28);
      }
      local_1 = 0;
      break;
    case (LogicalType *)0x1:
      ListType::GetChildType(type_00);
      local_1 = Contains<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_vector_cpp:423:37)_&>
                          (in_RSI,in_stack_ffffffffffffffe0);
      break;
    case (LogicalType *)0x2:
      MapType::KeyType((LogicalType *)0x2bd5d4d);
      bVar1 = Contains<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_vector_cpp:423:37)_&>
                        (in_RSI,in_stack_ffffffffffffffe0);
      local_1 = 1;
      if (!bVar1) {
        MapType::ValueType((LogicalType *)0x2bd5d77);
        local_1 = Contains<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_vector_cpp:423:37)_&>
                            (in_RSI,in_stack_ffffffffffffffe0);
      }
      break;
    default:
      local_1 = 0;
      break;
    case (LogicalType *)0x7:
      UnionType::CopyMemberTypes(in_stack_ffffffffffffffa8);
      local_60._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
            *)::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
      while (bVar1 = __gnu_cxx::
                     operator!=<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                 *)type_00,
                                (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff6f,
                                            CONCAT16(in_stack_ffffffffffffff6e,
                                                     in_stack_ffffffffffffff68))), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
        ::operator*(&local_60);
        in_stack_ffffffffffffff6f =
             Contains<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_vector_cpp:423:37)_&>
                       (in_RSI,in_stack_ffffffffffffffe0);
        if ((bool)in_stack_ffffffffffffff6f) {
          local_1 = 1;
          local_6c = 1;
          goto LAB_02bd5cc7;
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
        ::operator++(&local_60);
      }
      local_6c = 5;
LAB_02bd5cc7:
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 *)0x2bd5cd1);
      if (local_6c != 1) {
        local_1 = 0;
      }
      break;
    case (LogicalType *)0x8:
      ArrayType::GetChildType(type_00);
      local_1 = Contains<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_vector_cpp:423:37)_&>
                          (in_RSI,in_stack_ffffffffffffffe0);
    }
  }
LAB_02bd5da2:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool TypeVisitor::Contains(const LogicalType &type, F &&predicate) {
	if (predicate(type)) {
		return true;
	}
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		for (const auto &child : StructType::GetChildTypes(type)) {
			if (Contains(child.second, predicate)) {
				return true;
			}
		}
		return false;
	}
	case LogicalTypeId::UNION:
		for (const auto &child : UnionType::CopyMemberTypes(type)) {
			if (Contains(child.second, predicate)) {
				return true;
			}
		}
		return false;
	case LogicalTypeId::LIST:
		return Contains(ListType::GetChildType(type), predicate);
	case LogicalTypeId::ARRAY:
		return Contains(ArrayType::GetChildType(type), predicate);
	case LogicalTypeId::MAP:
		return Contains(MapType::KeyType(type), predicate) || Contains(MapType::ValueType(type), predicate);
	default:
		return false;
	}
}